

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void gen_exception_insn(DisasContext_conflict1 *s,uint64_t pc,int excp,uint32_t syndrome,
                       uint32_t target_el)

{
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_2;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->cpu_pc_arm64 + (long)tcg_ctx),pc);
  pTVar1 = tcg_const_i32_aarch64(tcg_ctx,excp);
  pTVar2 = tcg_const_i32_aarch64(tcg_ctx,syndrome);
  pTVar3 = tcg_const_i32_aarch64(tcg_ctx,target_el);
  local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_50 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  local_48 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  local_40 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,helper_exception_with_syndrome_aarch64,(TCGTemp *)0x0,4,&local_58);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  (s->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_exception_insn(DisasContext *s, uint64_t pc, int excp,
                               uint32_t syndrome, uint32_t target_el)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_a64_set_pc_im(tcg_ctx, pc);
    gen_exception(tcg_ctx, excp, syndrome, target_el);
    s->base.is_jmp = DISAS_NORETURN;
}